

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall QDirListingPrivate::pushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  uint uVar1;
  QFileSystemEntry *pQVar2;
  bool bVar3;
  pointer pQVar4;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *fentry;
  IteratorUniquePtr it;
  QString path;
  undefined4 in_stack_ffffffffffffff38;
  IteratorFlag in_stack_ffffffffffffff3c;
  QString *in_stack_ffffffffffffff40;
  QDuplicateTracker<QString,_32UL> *in_stack_ffffffffffffff48;
  qsizetype *__args;
  QFileInfoPrivate *in_stack_ffffffffffffff50;
  qsizetype *in_stack_ffffffffffffff60;
  undefined1 *local_50 [4];
  QFlagsStorage<QDirListing::IteratorFlag> local_2c;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pushDirectory::anon_class_8_1_f900dee0::operator()
            ((anon_class_8_1_f900dee0 *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  pQVar2 = in_RDI + 2;
  QFlags<QDirListing::IteratorFlag>::QFlags
            ((QFlags<QDirListing::IteratorFlag> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  bVar3 = QFlags<QDirListing::IteratorFlag>::testAnyFlags
                    ((QFlags<QDirListing::IteratorFlag> *)&pQVar2->m_lastSeparator,
                     (QFlags<QDirListing::IteratorFlag>)local_2c.i);
  if (bVar3) {
    in_stack_ffffffffffffff60 = &in_RDI[6].m_nativeFilePath.d.size;
    QDirEntryInfo::canonicalFilePath((QDirEntryInfo *)in_stack_ffffffffffffff48);
    bVar3 = QDuplicateTracker<QString,_32UL>::hasSeen
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    QString::~QString((QString *)0x293fa4);
    if (bVar3) goto LAB_0029419e;
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x294002);
  if (bVar3) {
    pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x294015);
    (*pQVar4->_vptr_QAbstractFileEngine[0x1e])(pQVar4,&local_20);
    local_50[0] = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x294047);
    uVar1._0_2_ = in_RDI[2].m_lastSeparator;
    uVar1._2_2_ = in_RDI[2].m_firstDotInFileName;
    (*pQVar4->_vptr_QAbstractFileEngine[0x22])
              (local_50,pQVar4,&local_20,(ulong)uVar1,&in_RDI[2].m_nativeFilePath);
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                        *)0x29408a);
    if (bVar3) {
      std::
      vector<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>,std::allocator<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>>
      ::
      emplace_back<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>
                ((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                  *)in_stack_ffffffffffffff50,
                 (unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                  *)in_stack_ffffffffffffff48);
    }
    std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
    ::~unique_ptr((unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                   *)in_stack_ffffffffffffff50);
  }
  else {
    bVar3 = std::optional::operator_cast_to_bool((optional<QFileInfo> *)0x2940f3);
    if (bVar3) {
      std::optional<QFileInfo>::operator->((optional<QFileInfo> *)0x294107);
      in_stack_ffffffffffffff50 =
           QSharedDataPointer<QFileInfoPrivate>::operator->
                     ((QSharedDataPointer<QFileInfoPrivate> *)in_stack_ffffffffffffff40);
    }
    __args = &in_RDI[6].m_filePath.d.size;
    std::make_unique<QFileSystemIterator,QFileSystemEntry&,QFlags<QDirListing::IteratorFlag>&>
              (in_RDI,(QFlags<QDirListing::IteratorFlag> *)in_stack_ffffffffffffff60);
    std::
    vector<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>,std::allocator<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>>
    ::emplace_back<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>
              ((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                *)in_stack_ffffffffffffff50,
               (unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)__args)
    ;
    std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::~unique_ptr
              ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               in_stack_ffffffffffffff40);
  }
LAB_0029419e:
  QString::~QString((QString *)0x2941ab);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDirListingPrivate::pushDirectory(QDirEntryInfo &entryInfo)
{
    const QString path = [&entryInfo] {
#ifdef Q_OS_WIN
        if (entryInfo.isSymLink())
            return entryInfo.canonicalFilePath();
#endif
        return entryInfo.filePath();
    }();


    if (iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::FollowDirSymlinks)) {
        // Stop link loops
        if (visitedLinks.hasSeen(entryInfo.canonicalFilePath()))
            return;
    }

    if (engine) {
        engine->setFileName(path);
        if (auto it = engine->beginEntryList(path, iteratorFlags, nameFilters)) {
            fileEngineIterators.emplace_back(std::move(it));
        } else {
            // No iterator; no entry list.
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QFileSystemEntry *fentry = nullptr;
        if (entryInfo.fileInfoOpt)
            fentry = &entryInfo.fileInfoOpt->d_ptr->fileEntry;
        else
            fentry = &entryInfo.entry;
        nativeIterators.emplace_back(std::make_unique<QFileSystemIterator>(*fentry, iteratorFlags));
#else
        qWarning("Qt was built with -no-feature-filesystemiterator: no files/plugins will be found!");
#endif
    }
}